

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O3

bool __thiscall
Fossilize::ConcurrentDatabase::has_entry(ConcurrentDatabase *this,ResourceTag tag,Hash hash)

{
  ExportedMetadataHeader *pEVar1;
  ulong uVar2;
  DatabaseInterface *pDVar3;
  byte *pbVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  byte *pbVar8;
  const_iterator cVar9;
  ulong uVar10;
  ulong uVar11;
  Hash local_20;
  
  uVar2 = (ulong)tag;
  pEVar1 = ((this->super_DatabaseInterface).impl)->imported_concurrent_metadata;
  if (pEVar1 == (ExportedMetadataHeader *)0x0) {
    local_20 = hash;
    bVar6 = DatabaseInterface::test_resource_filter(&this->super_DatabaseInterface,tag,hash);
    if (bVar6) {
      cVar9 = std::
              _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::find(&this->primed_hashes[uVar2]._M_h,&local_20);
      if (cVar9.super__Node_iterator_base<unsigned_long,_false>._M_cur != (__node_type *)0x0) {
        return (bool)1;
      }
      pDVar3 = (this->readonly_interface)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if ((pDVar3 != (DatabaseInterface *)0x0) &&
         (iVar7 = (*pDVar3->_vptr_DatabaseInterface[5])(pDVar3,uVar2,local_20), (char)iVar7 != '\0')
         ) {
        return (bool)1;
      }
      pDVar3 = (this->writeonly_interface)._M_t.
               super___uniq_ptr_impl<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
               ._M_t.
               super__Tuple_impl<0UL,_Fossilize::DatabaseInterface_*,_std::default_delete<Fossilize::DatabaseInterface>_>
               .super__Head_base<0UL,_Fossilize::DatabaseInterface_*,_false>._M_head_impl;
      if (pDVar3 != (DatabaseInterface *)0x0) {
        iVar7 = (*pDVar3->_vptr_DatabaseInterface[5])(pDVar3,uVar2,local_20);
        return (bool)(char)iVar7;
      }
    }
  }
  else {
    pbVar8 = (byte *)((long)&((ExportedMetadataHeader *)(pEVar1->lists + -1))->magic +
                     pEVar1->lists[uVar2].offset);
    uVar2 = pEVar1->lists[uVar2].count;
    pbVar4 = pbVar8;
    uVar5 = uVar2;
    while (0 < (long)uVar5) {
      uVar10 = uVar5 >> 1;
      uVar11 = ~uVar10 + uVar5;
      uVar5 = uVar10;
      if (pbVar4[uVar10] < hash) {
        pbVar4 = pbVar4 + uVar10 + 1;
        uVar5 = uVar11;
      }
    }
    if (pbVar4 != pbVar8 + uVar2) {
      return *pbVar4 <= hash;
    }
  }
  return false;
}

Assistant:

bool has_entry(ResourceTag tag, Hash hash) override
	{
		if (impl->imported_concurrent_metadata)
			return find_entry_in_concurrent_metadata(impl->imported_concurrent_metadata, tag, hash);

		if (!test_resource_filter(tag, hash))
			return false;

		if (primed_hashes[tag].count(hash))
			return true;

		// All threads must have called prepare and synchronized readonly_interface from that,
		// and from here on out readonly_interface is purely read-only, no need to lock just to check.
		if (readonly_interface && readonly_interface->has_entry(tag, hash))
			return true;

		return writeonly_interface && writeonly_interface->has_entry(tag, hash);
	}